

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O3

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::
ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>>
::construct<unsigned_int,float,float>
          (ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>>
           *this,uint *args,float *args_1,float *args_2)

{
  float fVar1;
  float fVar2;
  iterator __position;
  undefined1 auVar3 [16];
  Node *pNVar4;
  ulong uVar5;
  
  uVar5 = *(ulong *)(this + 8);
  if (*(ulong *)(this + 0x10) <= uVar5) {
    pNVar4 = __gnu_cxx::new_allocator<mapbox::detail::Earcut<unsigned_int>::Node>::allocate
                       ((new_allocator<mapbox::detail::Earcut<unsigned_int>::Node> *)(this + 0x30),
                        *(ulong *)(this + 0x10),(void *)0x0);
    *(Node **)this = pNVar4;
    __position._M_current = *(Node ***)(this + 0x20);
    if (__position._M_current == *(Node ***)(this + 0x28)) {
      std::
      vector<mapbox::detail::Earcut<unsigned_int>::Node*,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node*>>
      ::_M_realloc_insert<mapbox::detail::Earcut<unsigned_int>::Node*&>
                ((vector<mapbox::detail::Earcut<unsigned_int>::Node*,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node*>>
                  *)(this + 0x18),__position,(Node **)this);
    }
    else {
      *__position._M_current = pNVar4;
      *(long *)(this + 0x20) = *(long *)(this + 0x20) + 8;
    }
    uVar5 = 0;
  }
  *(ulong *)(this + 8) = uVar5 + 1;
  pNVar4 = (Node *)(*(long *)this + uVar5 * 0x48);
  fVar1 = *args_1;
  fVar2 = *args_2;
  pNVar4->i = *args;
  auVar3._8_4_ = SUB84((double)fVar2,0);
  auVar3._0_8_ = (double)fVar1;
  auVar3._12_4_ = (int)((ulong)(double)fVar2 >> 0x20);
  pNVar4->x = (double)fVar1;
  pNVar4->y = (double)auVar3._8_8_;
  pNVar4->prev = (Node *)0x0;
  pNVar4->next = (Node *)0x0;
  pNVar4->z = 0;
  pNVar4->prevZ = (Node *)0x0;
  pNVar4->nextZ = (Node *)0x0;
  pNVar4->steiner = false;
  return pNVar4;
}

Assistant:

T* construct(Args&&... args) {
            if (currentIndex >= blockSize) {
                currentBlock = alloc_traits::allocate(alloc, blockSize);
                allocations.emplace_back(currentBlock);
                currentIndex = 0;
            }
            T* object = &currentBlock[currentIndex++];
            alloc_traits::construct(alloc, object, std::forward<Args>(args)...);
            return object;
        }